

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsTextItem::mouseReleaseEvent(QGraphicsTextItem *this,QGraphicsSceneMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  Int IVar3;
  Int IVar4;
  QWidget *e;
  QWidgetPrivate *pQVar5;
  QGraphicsSceneMouseEvent *in_RDI;
  long in_FS_OFFSET;
  QWidget *widget;
  undefined8 in_stack_ffffffffffffff78;
  TextInteractionFlag other;
  TextInteractionFlag in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QGraphicsItem *in_stack_ffffffffffffffb0;
  undefined1 local_40 [36];
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_1c;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_18;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_14;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_10;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  other = (TextInteractionFlag)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)&in_RDI[1].super_QGraphicsSceneEvent.field_0x8 + 0x2c) & 1) == 0) {
    e = QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x98cd13);
    bVar6 = 0;
    if (e != (QWidget *)0x0) {
      local_1c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
           (QFlagsStorage<Qt::TextInteractionFlag>)
           QWidgetTextControl::textInteractionFlags
                     ((QWidgetTextControl *)
                      CONCAT17(in_stack_ffffffffffffff87,
                               (uint7)CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
                     );
      local_18.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
           (QFlagsStorage<Qt::TextInteractionFlag>)
           QFlags<Qt::TextInteractionFlag>::operator&
                     ((QFlags<Qt::TextInteractionFlag> *)
                      CONCAT17(in_stack_ffffffffffffff87,
                               CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff84,
                                                       in_stack_ffffffffffffff80))),other);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
      bVar6 = 0;
      if (IVar4 != 0) {
        (**(code **)(*(long *)&in_RDI->super_QGraphicsSceneEvent + 0x60))(local_40);
        QGraphicsSceneMouseEvent::pos(in_RDI);
        bVar6 = QRectF::contains((QPointF *)local_40);
      }
    }
    if ((bVar6 & 1) != 0) {
      pQVar5 = qt_widget_private((QWidget *)0x98cdb2);
      QGraphicsSceneMouseEvent::button
                ((QGraphicsSceneMouseEvent *)
                 CONCAT17(in_stack_ffffffffffffff87,
                          CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80))));
      QWidgetPrivate::handleSoftwareInputPanel
                ((QWidgetPrivate *)
                 CONCAT17(in_stack_ffffffffffffff87,
                          CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80))),
                 (MouseButton)((ulong)pQVar5 >> 0x20),SUB81((ulong)pQVar5 >> 0x18,0));
    }
    lVar1 = *(long *)&in_RDI[1].super_QGraphicsSceneEvent.field_0x8;
    *(byte *)(lVar1 + 0x2e) = *(byte *)(lVar1 + 0x2e) & 0xfe;
    QGraphicsTextItemPrivate::sendControlEvent
              ((QGraphicsTextItemPrivate *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(QEvent *)e);
  }
  else {
    QGraphicsItem::mouseReleaseEvent(in_stack_ffffffffffffffb0,in_RDI);
    QWidgetTextControl::textInteractionFlags
              ((QWidgetTextControl *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))));
    bVar2 = ::operator==((QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
                         SUB84((ulong)in_RDI >> 0x20,0),in_stack_ffffffffffffff80);
    uVar7 = false;
    if (bVar2) {
      local_c.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QGraphicsSceneMouseEvent::buttons
                     ((QGraphicsSceneMouseEvent *)
                      (ulong)CONCAT16(in_stack_ffffffffffffff86,
                                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
                     );
      uVar7 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_c);
    }
    if ((bool)uVar7 == false) {
      local_14.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QGraphicsSceneMouseEvent::buttons
                     ((QGraphicsSceneMouseEvent *)
                      (ulong)CONCAT16(in_stack_ffffffffffffff86,
                                      CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
                     );
      local_10.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QFlags<Qt::MouseButton>::operator&
                     ((QFlags<Qt::MouseButton> *)
                      CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffff86,
                                              CONCAT24(in_stack_ffffffffffffff84,
                                                       in_stack_ffffffffffffff80))),other);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
      if (IVar3 == 0) {
        *(undefined1 *)(*(long *)&in_RDI[1].super_QGraphicsSceneEvent.field_0x8 + 0x2c) = 0;
      }
    }
    else {
      *(undefined1 *)(*(long *)&in_RDI[1].super_QGraphicsSceneEvent.field_0x8 + 0x2c) = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsTextItem::mouseReleaseEvent(QGraphicsSceneMouseEvent *event)
{
    if (dd->useDefaultImpl) {
        QGraphicsItem::mouseReleaseEvent(event);
        if (dd->control->textInteractionFlags() == Qt::NoTextInteraction
            && !event->buttons()) {
            // User released last button on non-interactive item.
            dd->useDefaultImpl = false;
        } else  if ((event->buttons() & Qt::LeftButton) == 0) {
            // User released the left button on an interactive item.
            dd->useDefaultImpl = false;
        }
        return;
    }

    QWidget *widget = event->widget();
    if (widget && (dd->control->textInteractionFlags() & Qt::TextEditable) && boundingRect().contains(event->pos())) {
        qt_widget_private(widget)->handleSoftwareInputPanel(event->button(), dd->clickCausedFocus);
    }
    dd->clickCausedFocus = 0;
    dd->sendControlEvent(event);
}